

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

DWORD GetTickCount(void)

{
  ULONGLONG UVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    UVar1 = (*getTickCount64FallbackCB)();
    if (PAL_InitializeChakraCoreCalled != false) {
      return (DWORD)UVar1;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetTickCount(
         VOID)
{
    DWORD retval = 0;
    PERF_ENTRY(GetTickCount);
    ENTRY("GetTickCount ()\n");

    // Get the 64-bit count from GetTickCount64 and truncate the results.
    retval = (DWORD) GetTickCount64();

    LOGEXIT("GetTickCount returns DWORD %u\n", retval);
    PERF_EXIT(GetTickCount);
    return retval;
}